

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectest-interp.cc
# Opt level: O0

Result __thiscall
spectest::CommandRunner::OnAssertMalformedCommand
          (CommandRunner *this,AssertMalformedCommand *command)

{
  uint32_t uVar1;
  bool bVar2;
  undefined8 uVar3;
  string_view local_38;
  Enum local_24;
  AssertMalformedCommand *pAStack_20;
  Result result;
  AssertMalformedCommand *command_local;
  CommandRunner *this_local;
  
  uVar1 = (command->super_CommandMixin<(wabt::CommandType)3>).super_Command.line;
  pAStack_20 = command;
  wabt::string_view::string_view(&local_38,&command->filename);
  local_24 = (Enum)ReadInvalidModule(this,uVar1,local_38,pAStack_20->type,"assert_malformed");
  bVar2 = wabt::Succeeded((Result)local_24);
  if (bVar2) {
    uVar1 = (pAStack_20->super_CommandMixin<(wabt::CommandType)3>).super_Command.line;
    uVar3 = std::__cxx11::string::c_str();
    PrintError(this,uVar1,"expected module to be malformed: \"%s\"",uVar3);
    wabt::Result::Result((Result *)((long)&this_local + 4),Error);
  }
  else {
    wabt::Result::Result((Result *)((long)&this_local + 4),Ok);
  }
  return (Result)this_local._4_4_;
}

Assistant:

wabt::Result CommandRunner::OnAssertMalformedCommand(
    const AssertMalformedCommand* command) {
  wabt::Result result = ReadInvalidModule(command->line, command->filename,
                                    command->type, "assert_malformed");
  if (Succeeded(result)) {
    PrintError(command->line, "expected module to be malformed: \"%s\"",
               command->filename.c_str());
    return wabt::Result::Error;
  }

  return wabt::Result::Ok;
}